

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::gestureTargetsAtHotSpots
          (QGraphicsScenePrivate *this,QSet<QGesture_*> *gestures,GestureFlag flag,
          QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *targets,QSet<QGraphicsObject_*> *itemsSet,
          QSet<QGesture_*> *normal,QSet<QGesture_*> *conflicts)

{
  Span *pSVar1;
  QGraphicsItemPrivate *pQVar2;
  bool bVar3;
  const_iterator cVar4;
  QSet<QGesture_*> *value;
  ulong uVar5;
  const_iterator cVar6;
  int j;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  QGraphicsObject *itemobj;
  QGraphicsItem *item;
  GestureType gestureType;
  QGesture *gesture;
  QPoint local_98 [2];
  QGraphicsObject *local_88;
  QGraphicsItem *local_80;
  QArrayDataPointer<QGraphicsItem_*> local_78;
  GestureType local_5c;
  anon_struct_8_1_898a9ca8_for_storage local_58;
  piter local_50;
  QHash<QGesture_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x0;
  local_50 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&gestures->q_hash);
  do {
    if (local_50.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
        local_50.bucket == 0) {
      if (normal != (QSet<QGesture_*> *)0x0) {
        QHash<QGesture_*,_QHashDummyValue>::operator=(&normal->q_hash,&local_40);
      }
      QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pSVar1 = (local_50.d)->spans;
    uVar5 = local_50.bucket >> 7;
    local_58.data =
         *&pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)local_50.bucket & 0x7f]].storage.data;
    bVar3 = QGesture::hasHotSpot((QGesture *)local_58.data);
    if (bVar3) {
      local_5c = QGesture::gestureType((QGesture *)local_58.data);
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98[0].xp.m_i = 0;
      local_98[0].yp.m_i = 0;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      itemsAtPosition((QList<QGraphicsItem_*> *)&local_78,this,local_98,
                      (QPointF *)(*(long *)((long)local_58.data + 8) + 0x90),(QWidget *)0x0);
      puVar7 = (undefined1 *)0x0;
      do {
        if ((ulong)local_78.size <= puVar7) break;
        local_80 = local_78.ptr[(long)puVar7];
        QGraphicsItem::isBlockedByModalPanel(local_80,&local_80);
        local_88 = QGraphicsItem::toGraphicsObject(local_80);
        if (local_88 != (QGraphicsObject *)0x0) {
          pQVar2 = (local_80->d_ptr).d;
          cVar4 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::find
                            (&pQVar2->gestureContext,&local_5c);
          cVar6._M_node = (_Base_ptr)(pQVar2->gestureContext).d.d.ptr;
          if ((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
               *)cVar6._M_node !=
              (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
               *)0x0) {
            cVar6._M_node =
                 &(((QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                     *)cVar6._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          }
          if ((cVar4.i._M_node != (const_iterator)cVar6._M_node) &&
             ((flag == 0 || ((*(GestureFlag *)((long)cVar4.i._M_node + 0x24) & flag) != 0)))) {
            bVar3 = QHash<QGesture_*,_QHashDummyValue>::contains(&local_40,(QGesture **)&local_58);
            if (bVar3) {
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_40,(QGesture **)&local_58);
              if (conflicts != (QSet<QGesture_*> *)0x0) {
                QSet<QGesture_*>::insert((QSet<QGesture_*> *)local_98,(QGesture **)conflicts);
              }
            }
            else {
              QSet<QGesture_*>::insert((QSet<QGesture_*> *)local_98,(QGesture **)&local_40);
            }
            if (targets != (QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)0x0) {
              value = QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::operator[](targets,&local_88);
              QSet<QGesture_*>::insert((QSet<QGesture_*> *)local_98,(QGesture **)value);
            }
            if (itemsSet != (QSet<QGraphicsObject_*> *)0x0) {
              QSet<QGraphicsObject_*>::insert
                        ((QSet<QGraphicsObject_*> *)local_98,(QGraphicsObject **)itemsSet);
            }
          }
        }
        bVar3 = QGraphicsItem::isPanel(local_80);
        puVar7 = puVar7 + 1;
      } while (!bVar3);
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_78);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++(&local_50);
  } while( true );
}

Assistant:

void QGraphicsScenePrivate::gestureTargetsAtHotSpots(const QSet<QGesture *> &gestures,
                                              Qt::GestureFlag flag,
                                              QHash<QGraphicsObject *, QSet<QGesture *> > *targets,
                                              QSet<QGraphicsObject *> *itemsSet,
                                              QSet<QGesture *> *normal,
                                              QSet<QGesture *> *conflicts)
{
    QSet<QGesture *> normalGestures; // that are not in conflicted state.
    for (QGesture *gesture : gestures) {
        if (!gesture->hasHotSpot())
            continue;
        const Qt::GestureType gestureType = gesture->gestureType();
        const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), gesture->d_func()->sceneHotSpot, nullptr);
        for (int j = 0; j < items.size(); ++j) {
            QGraphicsItem *item = items.at(j);

            // Check if the item is blocked by a modal panel and use it as
            // a target instead of this item.
            (void) item->isBlockedByModalPanel(&item);

            if (QGraphicsObject *itemobj = item->toGraphicsObject()) {
                QGraphicsItemPrivate *d = item->QGraphicsItem::d_func();
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it =
                        d->gestureContext.constFind(gestureType);
                if (it != d->gestureContext.constEnd() && (!flag || (it.value() & flag))) {
                    if (normalGestures.contains(gesture)) {
                        normalGestures.remove(gesture);
                        if (conflicts)
                            conflicts->insert(gesture);
                    } else {
                        normalGestures.insert(gesture);
                    }
                    if (targets)
                        (*targets)[itemobj].insert(gesture);
                    if (itemsSet)
                        (*itemsSet).insert(itemobj);
                }
            }
            // Don't propagate through panels.
            if (item->isPanel())
                break;
        }
    }
    if (normal)
        *normal = normalGestures;
}